

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_choices_validation_longlong(void)

{
  cargo_t ctx;
  int iVar1;
  cargo_validation_t *vd;
  char *pcVar2;
  cargo_t cargo;
  char *args [3];
  longlong a;
  cargo_t local_30;
  char *local_28;
  char *pcStack_20;
  char *local_18;
  undefined1 local_10 [8];
  
  iVar1 = cargo_init(&local_30,0,"program");
  if (iVar1 == 0) {
    iVar1 = cargo_add_option(local_30,0,"--alpha -a",(char *)0x0,"L",local_10);
    ctx = local_30;
    if (iVar1 == 0) {
      vd = cargo_validate_choices
                     (CARGO_VALIDATE_CHOICES_NONE,CARGO_LONGLONG,3,0xffffffffffef0bb9,0x1ed36a0,
                      0xf69b5);
      iVar1 = cargo_add_validation(ctx,CARGO_VALIDATION_NONE,"--alpha",vd);
      if (iVar1 == 0) {
        local_18 = "5";
        local_28 = "program";
        pcStack_20 = "--alpha";
        iVar1 = cargo_parse(local_30,0,1,3,&local_28);
        if (iVar1 < 0) {
          local_18 = "-1111111";
          local_28 = "program";
          pcStack_20 = "--alpha";
          iVar1 = cargo_parse(local_30,0,1,3,&local_28);
          pcVar2 = "Failed to parse";
          if (iVar1 == 0) {
            local_18 = "32323232";
            local_28 = "program";
            pcStack_20 = "--alpha";
            iVar1 = cargo_parse(local_30,0,1,3,&local_28);
            if (iVar1 == 0) {
              local_18 = "1010101";
              local_28 = "program";
              pcStack_20 = "--alpha";
              iVar1 = cargo_parse(local_30,0,1,3,&local_28);
              if (iVar1 == 0) {
                local_18 = "4224422";
                local_28 = "program";
                pcStack_20 = "--alpha";
                pcVar2 = (char *)0x0;
                iVar1 = cargo_parse(local_30,0,1,3,&local_28);
                if (-1 < iVar1) {
                  pcVar2 = "Expected parse failure for 4224422";
                }
              }
            }
          }
        }
        else {
          pcVar2 = "Expected parse failure for 5";
        }
      }
      else {
        pcVar2 = "Failed to add validation";
      }
    }
    else {
      pcVar2 = "Failed to add option";
    }
    cargo_destroy(&local_30);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_choices_validation_longlong)
{
    long long int a;

    _CARGO_ADD_TEST_VALIDATE("L", &a,
            cargo_validate_choices, 0, CARGO_LONGLONG,
            3,
            (long long int)-1111111,
            (long long int)32323232,
            (long long int)1010101);
    _CARGO_TEST_VALIDATE_VALUE(5, 1);
    _CARGO_TEST_VALIDATE_VALUE(-1111111, 0);
    _CARGO_TEST_VALIDATE_VALUE(32323232, 0);
    _CARGO_TEST_VALIDATE_VALUE(1010101, 0);
    _CARGO_TEST_VALIDATE_VALUE(4224422, 1);
    _TEST_CLEANUP();
}